

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O1

void helicsCoreSetLoggingCallback
               (HelicsCore core,_func_void_int_char_ptr_char_ptr_void_ptr *logger,void *userdata,
               HelicsError *err)

{
  Core *pCVar1;
  _func_void_int_char_ptr_char_ptr_void_ptr *local_58;
  void *pvStack_50;
  code *local_48;
  code *pcStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    if (logger == (_func_void_int_char_ptr_char_ptr_void_ptr *)0x0) {
      local_28 = (code *)0x0;
      uStack_20 = 0;
      local_38 = 0;
      uStack_30 = 0;
      (*pCVar1->_vptr_Core[0x57])(pCVar1,0xfffffefd);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,3);
      }
    }
    else {
      pcStack_40 = std::
                   _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:60:41)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:60:41)>
                 ::_M_manager;
      local_58 = logger;
      pvStack_50 = userdata;
      (*pCVar1->_vptr_Core[0x57])(pCVar1,0xfffffefd);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
    }
  }
  return;
}

Assistant:

void helicsCoreSetLoggingCallback(HelicsCore core,
                                  void (*logger)(int loglevel, const char* identifier, const char* message, void* userdata),
                                  void* userdata,
                                  HelicsError* err)
{
    auto* coreObj = getCore(core, err);
    if (coreObj == nullptr) {
        return;
    }
    try {
        if (logger == nullptr) {
            coreObj->setLoggingCallback(helics::gLocalCoreId, {});
        } else {
            coreObj->setLoggingCallback(helics::gLocalCoreId,
                                        [logger, userdata](int loglevel, std::string_view ident, std::string_view message) {
                                            const std::string identifier(ident);
                                            const std::string mess(message);
                                            logger(loglevel, identifier.c_str(), mess.c_str(), userdata);
                                        });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}